

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::operator=
          (RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *this,
          ShaderResourceBindingVkImpl *pObj)

{
  ShaderResourceBindingVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (ShaderResourceBindingVkImpl *)0x0) {
      RefCountedObject<Diligent::IShaderResourceBindingVk>::Release
                ((RefCountedObject<Diligent::IShaderResourceBindingVk> *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (ShaderResourceBindingVkImpl *)0x0) {
      RefCountedObject<Diligent::IShaderResourceBindingVk>::AddRef
                ((RefCountedObject<Diligent::IShaderResourceBindingVk> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }